

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_graph.cpp
# Opt level: O3

Graph * Omega_h::add_edges(Graph *__return_storage_ptr__,Graph *g1,Graph *g2)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  pointer pcVar6;
  pointer pcVar7;
  Alloc *pAVar8;
  Graph *this;
  Alloc *pAVar9;
  int iVar10;
  long *plVar11;
  string *psVar12;
  Alloc *pAVar13;
  ulong uVar14;
  int iVar15;
  long lVar16;
  size_t sVar17;
  char cVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  ScopedTimer omega_h_scoped_function_timer;
  LOs v2e1;
  LOs e2v1;
  Write<int> e2v;
  LOs v2e;
  type f;
  Read<int> deg;
  LOs deg2;
  LOs deg1;
  LOs e2v2;
  LOs v2e2;
  ScopedTimer local_2c9;
  Alloc *local_2c8;
  undefined1 local_2c0 [32];
  Alloc *local_2a0;
  void *local_298;
  Alloc *local_290;
  void *local_288;
  Alloc *local_280;
  Alloc *local_278;
  Alloc *local_270;
  void *local_268;
  void *local_260;
  Write<int> local_258;
  undefined1 local_248 [16];
  size_t local_238;
  Alloc *local_230;
  Write<int> local_228;
  Write<int> local_218;
  Read<int> local_208;
  Alloc *local_1f8;
  void *pvStack_1f0;
  undefined1 local_1e8 [48];
  Alloc *local_1b8;
  Alloc *pAStack_1b0;
  Alloc *local_1a8;
  void *pvStack_1a0;
  Read<int> *local_190;
  Omega_h *local_188;
  Omega_h *local_180;
  Omega_h *local_178;
  Alloc *local_170;
  LOs local_168;
  Read<int> local_158;
  Read<int> local_148;
  Read<int> local_138;
  LOs local_128;
  LOs local_118;
  Write<int> local_108;
  Alloc *local_f8;
  void *local_f0;
  undefined1 local_e8 [32];
  Alloc *local_c8;
  void *local_c0;
  Alloc *local_b8;
  Alloc *local_b0;
  Alloc *local_a8;
  void *local_a0;
  Graph *local_98;
  Read<signed_char> local_90;
  Alloc *local_80;
  void *local_78;
  Alloc *local_70;
  void *local_68;
  Alloc *local_60;
  void *local_58;
  Alloc *local_50;
  void *local_48;
  Alloc *local_40;
  pointer local_38;
  
  local_f8 = (Alloc *)local_e8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_graph.cpp"
             ,"");
  plVar11 = (long *)std::__cxx11::string::append((char *)&local_f8);
  pAVar13 = (Alloc *)(plVar11 + 2);
  if ((Alloc *)*plVar11 == pAVar13) {
    local_1e8._0_8_ = pAVar13->size;
    local_1e8._8_8_ = plVar11[3];
    local_1f8 = (Alloc *)local_1e8;
  }
  else {
    local_1e8._0_8_ = pAVar13->size;
    local_1f8 = (Alloc *)*plVar11;
  }
  pvStack_1f0 = (void *)plVar11[1];
  *plVar11 = (long)pAVar13;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  local_258.shared_alloc_.alloc = (Alloc *)local_248;
  std::__cxx11::string::_M_construct((ulong)&local_258,'\x02');
  *(undefined2 *)&(local_258.shared_alloc_.alloc)->size = 0x3531;
  uVar14 = 0xf;
  if (local_1f8 != (Alloc *)local_1e8) {
    uVar14 = local_1e8._0_8_;
  }
  if (uVar14 < (ulong)((long)local_258.shared_alloc_.direct_ptr + (long)pvStack_1f0)) {
    uVar14 = 0xf;
    if (local_258.shared_alloc_.alloc != (Alloc *)local_248) {
      uVar14 = local_248._0_8_;
    }
    if ((ulong)((long)local_258.shared_alloc_.direct_ptr + (long)pvStack_1f0) <= uVar14) {
      plVar11 = (long *)std::__cxx11::string::replace
                                  ((ulong)&local_258,0,(char *)0x0,(ulong)local_1f8);
      goto LAB_002d69f3;
    }
  }
  plVar11 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_1f8,(ulong)local_258.shared_alloc_.alloc);
LAB_002d69f3:
  local_2c0._0_8_ = local_2c0 + 0x10;
  pAVar13 = (Alloc *)(plVar11 + 2);
  if ((Alloc *)*plVar11 == pAVar13) {
    local_2c0._16_8_ = pAVar13->size;
    local_2c0._24_8_ = plVar11[3];
  }
  else {
    local_2c0._16_8_ = pAVar13->size;
    local_2c0._0_8_ = (Alloc *)*plVar11;
  }
  local_2c0._8_8_ = plVar11[1];
  *plVar11 = (long)pAVar13;
  plVar11[1] = 0;
  *(undefined1 *)&pAVar13->size = 0;
  begin_code("add_edges",(char *)local_2c0._0_8_);
  pAVar13 = (Alloc *)(local_2c0 + 0x10);
  if ((Alloc *)local_2c0._0_8_ != pAVar13) {
    operator_delete((void *)local_2c0._0_8_,(ulong)(local_2c0._16_8_ + 1));
  }
  if (local_258.shared_alloc_.alloc != (Alloc *)local_248) {
    operator_delete(local_258.shared_alloc_.alloc,local_248._0_8_ + 1);
  }
  if (local_1f8 != (Alloc *)local_1e8) {
    operator_delete(local_1f8,local_1e8._0_8_ + 1);
  }
  if (local_f8 != (Alloc *)local_e8) {
    operator_delete(local_f8,local_e8._0_8_ + 1);
  }
  local_258.shared_alloc_.alloc = (g1->a2ab).write_.shared_alloc_.alloc;
  if (((ulong)local_258.shared_alloc_.alloc & 7) == 0 &&
      local_258.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_258.shared_alloc_.alloc = (Alloc *)((local_258.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_258.shared_alloc_.alloc)->use_count = (local_258.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_258.shared_alloc_.direct_ptr = (g1->a2ab).write_.shared_alloc_.direct_ptr;
  local_228.shared_alloc_.alloc = (g1->ab2b).write_.shared_alloc_.alloc;
  if (((ulong)local_228.shared_alloc_.alloc & 7) == 0 &&
      local_228.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_228.shared_alloc_.alloc = (Alloc *)((local_228.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_228.shared_alloc_.alloc)->use_count = (local_228.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_228.shared_alloc_.direct_ptr = (g1->ab2b).write_.shared_alloc_.direct_ptr;
  local_40 = (g2->a2ab).write_.shared_alloc_.alloc;
  if (((ulong)local_40 & 7) == 0 && local_40 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_40 = (Alloc *)(local_40->size * 8 + 1);
    }
    else {
      local_40->use_count = local_40->use_count + 1;
    }
  }
  pAVar9 = local_40;
  pcVar6 = (pointer)(g2->a2ab).write_.shared_alloc_.direct_ptr;
  local_50 = (g2->ab2b).write_.shared_alloc_.alloc;
  if (((ulong)local_50 & 7) == 0 && local_50 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_50 = (Alloc *)(local_50->size * 8 + 1);
    }
    else {
      local_50->use_count = local_50->use_count + 1;
    }
  }
  local_260 = (g2->ab2b).write_.shared_alloc_.direct_ptr;
  if (((ulong)local_258.shared_alloc_.alloc & 1) == 0) {
    sVar17 = (local_258.shared_alloc_.alloc)->size;
  }
  else {
    sVar17 = (ulong)local_258.shared_alloc_.alloc >> 3;
  }
  local_118.write_.shared_alloc_.alloc = local_258.shared_alloc_.alloc;
  if (((ulong)local_258.shared_alloc_.alloc & 7) == 0 &&
      local_258.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_118.write_.shared_alloc_.alloc =
           (Alloc *)((local_258.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_258.shared_alloc_.alloc)->use_count = (local_258.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_2c8 = local_50;
  local_2c0._0_8_ = pAVar13;
  local_118.write_.shared_alloc_.direct_ptr = local_258.shared_alloc_.direct_ptr;
  local_98 = __return_storage_ptr__;
  local_48 = local_260;
  local_38 = pcVar6;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2c0,"deg1","");
  get_degrees((Omega_h *)&local_60,&local_118,(string *)local_2c0);
  local_238 = sVar17;
  local_178 = (Omega_h *)&local_60;
  if ((Alloc *)local_2c0._0_8_ != pAVar13) {
    operator_delete((void *)local_2c0._0_8_,(ulong)(local_2c0._16_8_ + 1));
  }
  pAVar8 = local_118.write_.shared_alloc_.alloc;
  if (((ulong)local_118.write_.shared_alloc_.alloc & 7) == 0 &&
      local_118.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_118.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_118.write_.shared_alloc_.alloc);
      operator_delete(pAVar8,0x48);
    }
  }
  bVar19 = pAVar9 != (Alloc *)0x0;
  bVar20 = ((ulong)pAVar9 & 7) == 0;
  local_128.write_.shared_alloc_.alloc = pAVar9;
  if (bVar20 && bVar19) {
    if (entering_parallel == '\x01') {
      local_128.write_.shared_alloc_.alloc = (Alloc *)(pAVar9->size * 8 + 1);
    }
    else {
      pAVar9->use_count = pAVar9->use_count + 1;
    }
  }
  local_2c0._0_8_ = pAVar13;
  local_128.write_.shared_alloc_.direct_ptr = pcVar6;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2c0,"deg2","");
  get_degrees((Omega_h *)&local_70,&local_128,(string *)local_2c0);
  local_180 = (Omega_h *)&local_70;
  if ((Alloc *)local_2c0._0_8_ != pAVar13) {
    operator_delete((void *)local_2c0._0_8_,(ulong)(local_2c0._16_8_ + 1));
  }
  pAVar8 = local_128.write_.shared_alloc_.alloc;
  if (((ulong)local_128.write_.shared_alloc_.alloc & 7) == 0 &&
      local_128.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_128.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_128.write_.shared_alloc_.alloc);
      operator_delete(pAVar8,0x48);
    }
  }
  local_138.write_.shared_alloc_.alloc = local_60;
  if (((ulong)local_60 & 7) == 0 && local_60 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_138.write_.shared_alloc_.alloc = (Alloc *)(local_60->size * 8 + 1);
    }
    else {
      local_60->use_count = local_60->use_count + 1;
    }
  }
  local_138.write_.shared_alloc_.direct_ptr = local_58;
  local_148.write_.shared_alloc_.alloc = local_70;
  if (((ulong)local_70 & 7) == 0 && local_70 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_148.write_.shared_alloc_.alloc = (Alloc *)(local_70->size * 8 + 1);
    }
    else {
      local_70->use_count = local_70->use_count + 1;
    }
  }
  local_148.write_.shared_alloc_.direct_ptr = local_68;
  local_2c0._0_8_ = pAVar13;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2c0,"deg1+2","");
  add_each<int>((Omega_h *)&local_80,&local_138,&local_148,(string *)local_2c0);
  local_188 = (Omega_h *)&local_80;
  if ((Alloc *)local_2c0._0_8_ != pAVar13) {
    operator_delete((void *)local_2c0._0_8_,(ulong)(local_2c0._16_8_ + 1));
  }
  pAVar8 = local_148.write_.shared_alloc_.alloc;
  if (((ulong)local_148.write_.shared_alloc_.alloc & 7) == 0 &&
      local_148.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_148.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_148.write_.shared_alloc_.alloc);
      operator_delete(pAVar8,0x48);
    }
  }
  pAVar8 = local_138.write_.shared_alloc_.alloc;
  if (((ulong)local_138.write_.shared_alloc_.alloc & 7) == 0 &&
      local_138.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_138.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_138.write_.shared_alloc_.alloc);
      operator_delete(pAVar8,0x48);
    }
  }
  local_158.write_.shared_alloc_.alloc = local_80;
  if (((ulong)local_80 & 7) == 0 && local_80 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_158.write_.shared_alloc_.alloc = (Alloc *)(local_80->size * 8 + 1);
    }
    else {
      local_80->use_count = local_80->use_count + 1;
    }
  }
  local_158.write_.shared_alloc_.direct_ptr = local_78;
  psVar12 = Write<int>::name_abi_cxx11_(&local_258);
  pcVar7 = (psVar12->_M_dataplus)._M_p;
  local_2c0._0_8_ = pAVar13;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_2c0,pcVar7,pcVar7 + psVar12->_M_string_length);
  offset_scan<int>((Omega_h *)&local_208,&local_158,(string *)local_2c0);
  if ((Alloc *)local_2c0._0_8_ != pAVar13) {
    operator_delete((void *)local_2c0._0_8_,(ulong)(local_2c0._16_8_ + 1));
  }
  pAVar8 = local_158.write_.shared_alloc_.alloc;
  if (((ulong)local_158.write_.shared_alloc_.alloc & 7) == 0 &&
      local_158.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_158.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_158.write_.shared_alloc_.alloc);
      operator_delete(pAVar8,0x48);
    }
  }
  local_190 = &local_208;
  iVar10 = Read<int>::last(local_190);
  psVar12 = Write<int>::name_abi_cxx11_(&local_228);
  sVar17 = local_238;
  pcVar7 = (psVar12->_M_dataplus)._M_p;
  local_2c0._0_8_ = pAVar13;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_2c0,pcVar7,pcVar7 + psVar12->_M_string_length);
  Write<int>::Write(&local_218,iVar10,(string *)local_2c0);
  if ((Alloc *)local_2c0._0_8_ != pAVar13) {
    operator_delete((void *)local_2c0._0_8_,(ulong)(local_2c0._16_8_ + 1));
  }
  local_f8 = local_258.shared_alloc_.alloc;
  if (((ulong)local_258.shared_alloc_.alloc & 7) == 0 &&
      local_258.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_f8 = (Alloc *)((local_258.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_258.shared_alloc_.alloc)->use_count = (local_258.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_f0 = local_258.shared_alloc_.direct_ptr;
  local_e8._0_8_ = pAVar9;
  if (bVar20 && bVar19) {
    if (entering_parallel == '\x01') {
      local_e8._0_8_ = (Alloc *)(pAVar9->size * 8 + 1);
    }
    else {
      pAVar9->use_count = pAVar9->use_count + 1;
    }
  }
  local_e8._16_8_ = local_208.write_.shared_alloc_.alloc;
  if (((ulong)local_208.write_.shared_alloc_.alloc & 7) == 0 &&
      local_208.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_e8._16_8_ = (local_208.write_.shared_alloc_.alloc)->size * 8 + 1;
    }
    else {
      (local_208.write_.shared_alloc_.alloc)->use_count =
           (local_208.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_e8._24_8_ = local_208.write_.shared_alloc_.direct_ptr;
  local_c8 = local_218.shared_alloc_.alloc;
  if (((ulong)local_218.shared_alloc_.alloc & 7) == 0 &&
      local_218.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_c8 = (Alloc *)((local_218.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_218.shared_alloc_.alloc)->use_count = (local_218.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_c0 = local_218.shared_alloc_.direct_ptr;
  local_b8 = local_228.shared_alloc_.alloc;
  if (((ulong)local_228.shared_alloc_.alloc & 7) == 0 &&
      local_228.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_b8 = (Alloc *)((local_228.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_228.shared_alloc_.alloc)->use_count = (local_228.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_230 = (Alloc *)local_228.shared_alloc_.direct_ptr;
  local_b0 = (Alloc *)local_228.shared_alloc_.direct_ptr;
  local_a8 = local_2c8;
  bVar21 = ((ulong)local_2c8 & 7) == 0;
  cVar18 = bVar21 && local_2c8 != (Alloc *)0x0;
  if (bVar21 && local_2c8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_a8 = (Alloc *)(local_2c8->size * 8 + 1);
    }
    else {
      local_2c8->use_count = local_2c8->use_count + 1;
    }
  }
  local_a0 = local_260;
  local_1f8 = local_f8;
  if (((ulong)local_f8 & 7) == 0 && local_f8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1f8 = (Alloc *)(local_f8->size * 8 + 1);
    }
    else {
      local_f8->use_count = local_f8->use_count + 1;
    }
  }
  pvStack_1f0 = local_258.shared_alloc_.direct_ptr;
  local_1e8._0_8_ = local_e8._0_8_;
  if ((local_e8._0_8_ & 7) == 0 && (Alloc *)local_e8._0_8_ != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1e8._0_8_ = *(size_t *)local_e8._0_8_ * 8 + 1;
    }
    else {
      *(int *)(local_e8._0_8_ + 0x30) = *(int *)(local_e8._0_8_ + 0x30) + 1;
    }
  }
  local_1e8._16_8_ = local_e8._16_8_;
  if ((local_e8._16_8_ & 7) == 0 && (Alloc *)local_e8._16_8_ != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1e8._16_8_ = *(size_t *)local_e8._16_8_ * 8 + 1;
    }
    else {
      *(int *)(local_e8._16_8_ + 0x30) = *(int *)(local_e8._16_8_ + 0x30) + 1;
    }
  }
  local_1e8._24_8_ = local_208.write_.shared_alloc_.direct_ptr;
  local_1e8._32_8_ = local_c8;
  if (((ulong)local_c8 & 7) == 0 && local_c8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1e8._32_8_ = local_c8->size * 8 + 1;
    }
    else {
      local_c8->use_count = local_c8->use_count + 1;
    }
  }
  local_1e8._40_8_ = local_218.shared_alloc_.direct_ptr;
  local_1b8 = local_b8;
  if (((ulong)local_b8 & 7) == 0 && local_b8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1b8 = (Alloc *)(local_b8->size * 8 + 1);
    }
    else {
      local_b8->use_count = local_b8->use_count + 1;
    }
  }
  pAStack_1b0 = (Alloc *)local_228.shared_alloc_.direct_ptr;
  local_1a8 = local_a8;
  if (((ulong)local_a8 & 7) == 0 && local_a8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1a8 = (Alloc *)(local_a8->size * 8 + 1);
    }
    else {
      local_a8->use_count = local_a8->use_count + 1;
    }
  }
  pvStack_1a0 = local_260;
  local_1e8._8_8_ = pcVar6;
  local_170 = pAVar9;
  local_e8._8_8_ = pcVar6;
  if (1 < (int)(sVar17 >> 2)) {
    local_238 = CONCAT71(local_238._1_7_,cVar18);
    local_2c0._8_8_ = local_258.shared_alloc_.direct_ptr;
    local_2c0._0_8_ = local_1f8;
    if (((ulong)local_1f8 & 7) == 0 && local_1f8 != (Alloc *)0x0) {
      local_1f8->use_count = local_1f8->use_count + -1;
      local_2c0._0_8_ = local_1f8->size * 8 + 1;
    }
    local_1f8 = (Alloc *)0x0;
    pvStack_1f0 = (void *)0x0;
    local_2c0._16_8_ = local_1e8._0_8_;
    if ((local_1e8._0_8_ & 7) == 0 && (Alloc *)local_1e8._0_8_ != (Alloc *)0x0) {
      *(int *)(local_1e8._0_8_ + 0x30) = *(int *)(local_1e8._0_8_ + 0x30) + -1;
      local_2c0._16_8_ = *(size_t *)local_1e8._0_8_ * 8 + 1;
    }
    local_1e8._0_8_ = (Alloc *)0x0;
    local_1e8._8_8_ = (pointer)0x0;
    local_298 = local_208.write_.shared_alloc_.direct_ptr;
    local_2a0 = (Alloc *)local_1e8._16_8_;
    if ((local_1e8._16_8_ & 7) == 0 && (Alloc *)local_1e8._16_8_ != (Alloc *)0x0) {
      *(int *)(local_1e8._16_8_ + 0x30) = *(int *)(local_1e8._16_8_ + 0x30) + -1;
      local_2a0 = (Alloc *)(*(size_t *)local_1e8._16_8_ * 8 + 1);
    }
    local_1e8._16_8_ = (Alloc *)0x0;
    local_1e8._24_8_ = 0;
    local_288 = local_218.shared_alloc_.direct_ptr;
    local_290 = (Alloc *)local_1e8._32_8_;
    if ((local_1e8._32_8_ & 7) == 0 && (Alloc *)local_1e8._32_8_ != (Alloc *)0x0) {
      *(int *)(local_1e8._32_8_ + 0x30) = *(int *)(local_1e8._32_8_ + 0x30) + -1;
      local_290 = (Alloc *)(*(long *)local_1e8._32_8_ * 8 + 1);
    }
    local_1e8._32_8_ = (Alloc *)0x0;
    local_1e8._40_8_ = (void *)0x0;
    local_278 = (Alloc *)local_228.shared_alloc_.direct_ptr;
    local_280 = local_1b8;
    if (((ulong)local_1b8 & 7) == 0 && local_1b8 != (Alloc *)0x0) {
      local_1b8->use_count = local_1b8->use_count + -1;
      local_280 = (Alloc *)(local_1b8->size * 8 + 1);
    }
    local_1b8 = (Alloc *)0x0;
    pAStack_1b0 = (Alloc *)0x0;
    local_268 = local_260;
    local_270 = local_1a8;
    if (((ulong)local_1a8 & 7) == 0 && local_1a8 != (Alloc *)0x0) {
      local_1a8->use_count = local_1a8->use_count + -1;
      local_270 = (Alloc *)(local_1a8->size * 8 + 1);
    }
    local_1a8 = (Alloc *)0x0;
    pvStack_1a0 = (void *)0x0;
    entering_parallel = '\0';
    uVar14 = 0;
    while (local_2c0._24_8_ = pcVar6, uVar14 != ((sVar17 >> 2) + 0xffffffff & 0xffffffff)) {
      iVar10 = *(int *)((long)local_258.shared_alloc_.direct_ptr + uVar14 * 4);
      iVar2 = *(int *)((long)local_258.shared_alloc_.direct_ptr + uVar14 * 4 + 4);
      iVar3 = *(int *)(pcVar6 + uVar14 * 4);
      iVar4 = *(int *)(pcVar6 + uVar14 * 4 + 4);
      iVar15 = *(int *)((long)local_208.write_.shared_alloc_.direct_ptr + uVar14 * 4);
      iVar5 = *(int *)((long)local_208.write_.shared_alloc_.direct_ptr + uVar14 * 4 + 4);
      if (iVar10 < iVar2) {
        lVar16 = 0;
        do {
          *(undefined4 *)((long)local_218.shared_alloc_.direct_ptr + lVar16 * 4 + (long)iVar15 * 4)
               = *(undefined4 *)
                  ((long)(size_t *)local_228.shared_alloc_.direct_ptr +
                  lVar16 * 4 + (long)iVar10 * 4);
          lVar16 = lVar16 + 1;
        } while ((long)iVar2 - (long)iVar10 != lVar16);
        iVar15 = (int)lVar16 + iVar15;
      }
      if (iVar3 < iVar4) {
        lVar16 = 0;
        do {
          *(undefined4 *)((long)local_218.shared_alloc_.direct_ptr + lVar16 * 4 + (long)iVar15 * 4)
               = *(undefined4 *)((long)local_260 + lVar16 * 4 + (long)iVar3 * 4);
          lVar16 = lVar16 + 1;
        } while ((long)iVar4 - (long)iVar3 != lVar16);
        iVar15 = iVar15 + (int)lVar16;
      }
      uVar14 = uVar14 + 1;
      if (iVar15 != iVar5) {
        fail("assertion %s failed at %s +%d\n","k == end",
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_graph.cpp"
             ,0x24);
      }
    }
    add_edges(Omega_h::Graph,Omega_h::Graph)::$_0::~__0((__0 *)local_2c0);
    cVar18 = (char)local_238;
  }
  add_edges(Omega_h::Graph,Omega_h::Graph)::$_0::~__0((__0 *)&local_1f8);
  this = local_98;
  local_168.write_.shared_alloc_.alloc = local_208.write_.shared_alloc_.alloc;
  if (((ulong)local_208.write_.shared_alloc_.alloc & 7) == 0 &&
      local_208.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_168.write_.shared_alloc_.alloc =
           (Alloc *)((local_208.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_208.write_.shared_alloc_.alloc)->use_count =
           (local_208.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_168.write_.shared_alloc_.direct_ptr = local_208.write_.shared_alloc_.direct_ptr;
  local_108.shared_alloc_.alloc = local_218.shared_alloc_.alloc;
  if (((ulong)local_218.shared_alloc_.alloc & 7) == 0 &&
      local_218.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_108.shared_alloc_.alloc = (Alloc *)((local_218.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_218.shared_alloc_.alloc)->use_count = (local_218.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_108.shared_alloc_.direct_ptr = local_218.shared_alloc_.direct_ptr;
  Read<int>::Read(&local_90,&local_108);
  Graph::Graph(this,&local_168,(LOs *)&local_90);
  if (((ulong)local_90.write_.shared_alloc_.alloc & 7) == 0 &&
      local_90.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_90.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_90.write_.shared_alloc_.alloc);
      operator_delete(local_90.write_.shared_alloc_.alloc,0x48);
    }
  }
  pAVar13 = local_108.shared_alloc_.alloc;
  if (((ulong)local_108.shared_alloc_.alloc & 7) == 0 &&
      local_108.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_108.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_108.shared_alloc_.alloc);
      operator_delete(pAVar13,0x48);
    }
  }
  pAVar13 = local_168.write_.shared_alloc_.alloc;
  if (((ulong)local_168.write_.shared_alloc_.alloc & 7) == 0 &&
      local_168.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_168.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_168.write_.shared_alloc_.alloc);
      operator_delete(pAVar13,0x48);
    }
  }
  add_edges(Omega_h::Graph,Omega_h::Graph)::$_0::~__0((__0 *)&local_f8);
  if (((ulong)local_218.shared_alloc_.alloc & 7) == 0 &&
      local_218.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_218.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_218.shared_alloc_.alloc);
      operator_delete(local_218.shared_alloc_.alloc,0x48);
    }
  }
  if (((ulong)local_208.write_.shared_alloc_.alloc & 7) == 0 &&
      local_208.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_208.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_208.write_.shared_alloc_.alloc);
      operator_delete(local_208.write_.shared_alloc_.alloc,0x48);
    }
  }
  if (((ulong)local_80 & 7) == 0 && local_80 != (Alloc *)0x0) {
    piVar1 = &local_80->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_80);
      operator_delete(local_80,0x48);
    }
  }
  if (((ulong)local_70 & 7) == 0 && local_70 != (Alloc *)0x0) {
    piVar1 = &local_70->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_70);
      operator_delete(local_70,0x48);
    }
  }
  if (((ulong)local_60 & 7) == 0 && local_60 != (Alloc *)0x0) {
    piVar1 = &local_60->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_60);
      operator_delete(local_60,0x48);
    }
  }
  pAVar13 = local_2c8;
  if (cVar18 != '\0') {
    piVar1 = &local_2c8->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_2c8);
      operator_delete(pAVar13,0x48);
    }
  }
  pAVar13 = local_170;
  if (bVar20 && bVar19) {
    piVar1 = &local_170->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_170);
      operator_delete(pAVar13,0x48);
    }
  }
  pAVar13 = local_228.shared_alloc_.alloc;
  if (((ulong)local_228.shared_alloc_.alloc & 7) == 0 &&
      local_228.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_228.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_228.shared_alloc_.alloc);
      operator_delete(pAVar13,0x48);
    }
  }
  pAVar13 = local_258.shared_alloc_.alloc;
  if (((ulong)local_258.shared_alloc_.alloc & 7) == 0 &&
      local_258.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_258.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_258.shared_alloc_.alloc);
      operator_delete(pAVar13,0x48);
    }
  }
  ScopedTimer::~ScopedTimer(&local_2c9);
  return this;
}

Assistant:

Graph add_edges(Graph g1, Graph g2) {
  OMEGA_H_TIME_FUNCTION;
  auto v2e1 = g1.a2ab;
  auto e2v1 = g1.ab2b;
  auto v2e2 = g2.a2ab;
  auto e2v2 = g2.ab2b;
  auto nv = v2e1.size() - 1;
  auto deg1 = get_degrees(v2e1, "deg1");
  auto deg2 = get_degrees(v2e2, "deg2");
  auto deg = add_each(deg1, deg2, "deg1+2");
  auto v2e = offset_scan(deg, v2e1.name());
  Write<LO> e2v(v2e.last(), e2v1.name());
  auto f = OMEGA_H_LAMBDA(LO v) {
    auto begin1 = v2e1[v];
    auto end1 = v2e1[v + 1];
    auto begin2 = v2e2[v];
    auto end2 = v2e2[v + 1];
    auto begin = v2e[v];
    auto end = v2e[v + 1];
    auto k = begin;
    for (auto j = begin1; j < end1; ++j) e2v[k++] = e2v1[j];
    for (auto j = begin2; j < end2; ++j) e2v[k++] = e2v2[j];
    OMEGA_H_CHECK(k == end);
  };
  parallel_for(nv, f, "add_edges");
  return Graph(v2e, e2v);
}